

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

QRect __thiscall QCommandLinkButtonPrivate::titleRect(QCommandLinkButtonPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QCommandLinkButtonPrivate *this_00;
  QCommandLinkButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  QCommandLinkButton *q;
  QFontMetrics fm;
  QRect r;
  int in_stack_ffffffffffffff6c;
  QRect *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  QCommandLinkButtonPrivate *pQVar6;
  undefined8 in_stack_ffffffffffffffa0;
  QIcon in_stack_ffffffffffffffa8;
  int local_48 [2];
  undefined1 *local_40;
  QRect local_38;
  undefined1 local_28 [16];
  QFont local_18 [16];
  long local_8;
  undefined1 auVar7 [12];
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  this_00 = (QCommandLinkButtonPrivate *)q_func(in_RDI);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = QWidget::rect((QWidget *)in_RDI);
  iVar2 = textOffset(this_00);
  iVar3 = topMargin(in_RDI);
  rightMargin(in_RDI);
  local_28 = (undefined1  [16])
             QRect::adjusted((QRect *)in_stack_ffffffffffffffa8.d,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (int)in_stack_ffffffffffffffa0,(int)((ulong)pQVar6 >> 0x20),(int)pQVar6
                            );
  bVar1 = QString::isEmpty((QString *)0x55569b);
  if (bVar1) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    titleFont(this_00);
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_40,local_18);
    QFont::~QFont(local_18);
    iVar4 = QRect::top((QRect *)0x5556eb);
    local_48[1] = 0;
    QAbstractButton::icon((QAbstractButton *)CONCAT44(iVar4,in_stack_ffffffffffffff78));
    QAbstractButton::iconSize((QAbstractButton *)CONCAT44(iVar3,iVar2));
    QIcon::actualSize((QSize *)&stack0xffffffffffffffa8,(Mode)&stack0xffffffffffffffa0,On);
    iVar2 = QSize::height((QSize *)0x55573a);
    iVar3 = QFontMetrics::height();
    local_48[0] = (iVar2 - iVar3) / 2;
    qMax<int>(local_48 + 1,local_48);
    QRect::setTop(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffa8);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar5.x1.m_i = local_28._0_4_;
  auVar7._4_4_ = local_28._4_4_;
  QVar5.x2.m_i = local_28._8_4_;
  QVar5.y2.m_i = local_28._12_4_;
  return QVar5;
}

Assistant:

QRect QCommandLinkButtonPrivate::titleRect() const
{
    Q_Q(const QCommandLinkButton);
    QRect r = q->rect().adjusted(textOffset(), topMargin(), -rightMargin(), 0);
    if (description.isEmpty())
    {
        QFontMetrics fm(titleFont());
        r.setTop(r.top() + qMax(0, (q->icon().actualSize(q->iconSize()).height()
                 - fm.height()) / 2));
    }

    return r;
}